

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

shared_ptr<notch::core::ABackpropLayer> __thiscall
notch::core::ConvolutionLayer2D<3UL>::makeClone(ConvolutionLayer2D<3UL> *this)

{
  bool bVar1;
  runtime_error *this_00;
  element_type *peVar2;
  element_type *peVar3;
  int in_ECX;
  void *__child_stack;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  void *in_R8;
  shared_ptr<notch::core::ABackpropLayer> sVar4;
  unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_>
  local_80;
  valarray<float> local_78;
  valarray<float> local_68;
  SharedBuffers local_58;
  shared_ptr<notch::core::ConvolutionLayer2D<3UL>_> p;
  ConvolutionLayer2D<3UL> *this_local;
  
  ::std::
  make_shared<notch::core::ConvolutionLayer2D<3ul>,notch::core::ConvolutionLayer2D<3ul>const&>
            ((ConvolutionLayer2D<3UL> *)&stack0xffffffffffffffd8);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffd8);
  if (bVar1) {
    SharedBuffers::clone(&local_58,(__fn *)(in_RSI + 8),__child_stack,in_ECX,in_R8);
    peVar2 = std::
             __shared_ptr_access<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffd8);
    SharedBuffers::operator=(&(peVar2->super_ABackpropLayer).shared,&local_58);
    SharedBuffers::~SharedBuffers(&local_58);
    std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
              )(in_RSI + 0x58));
    ::std::make_shared<std::valarray<float>,std::valarray<float>&>(&local_68);
    peVar2 = std::
             __shared_ptr_access<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffd8);
    std::shared_ptr<std::valarray<float>_>::operator=
              (&peVar2->weights,(shared_ptr<std::valarray<float>_> *)&local_68);
    std::shared_ptr<std::valarray<float>_>::~shared_ptr
              ((shared_ptr<std::valarray<float>_> *)&local_68);
    std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
              )(in_RSI + 0x68));
    ::std::make_shared<std::valarray<float>,std::valarray<float>&>(&local_78);
    peVar2 = std::
             __shared_ptr_access<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffd8);
    std::shared_ptr<std::valarray<float>_>::operator=
              (&peVar2->bias,(shared_ptr<std::valarray<float>_> *)&local_78);
    std::shared_ptr<std::valarray<float>_>::~shared_ptr
              ((shared_ptr<std::valarray<float>_> *)&local_78);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xb8));
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(in_RSI + 0xb8));
      (*peVar3->_vptr_ALearningPolicy[1])(&local_80);
      peVar2 = std::
               __shared_ptr_access<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<notch::core::ConvolutionLayer2D<3UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xffffffffffffffd8);
      ::std::shared_ptr<notch::core::ALearningPolicy>::operator=(&peVar2->policy,&local_80);
      std::
      unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_>::
      ~unique_ptr(&local_80);
    }
    ::std::shared_ptr<notch::core::ABackpropLayer>::
    shared_ptr<notch::core::ConvolutionLayer2D<3ul>,void>
              ((shared_ptr<notch::core::ABackpropLayer> *)this,
               (shared_ptr<notch::core::ConvolutionLayer2D<3UL>_> *)&stack0xffffffffffffffd8);
    std::shared_ptr<notch::core::ConvolutionLayer2D<3UL>_>::~shared_ptr
              ((shared_ptr<notch::core::ConvolutionLayer2D<3UL>_> *)&stack0xffffffffffffffd8);
    sVar4.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar4.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &this->super_ABackpropLayer;
    return (shared_ptr<notch::core::ABackpropLayer>)
           sVar4.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"cannot clone layer");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<ABackpropLayer> makeClone() const {
        auto p = std::make_shared<ConvolutionLayer2D>(*this);
        if (!p) {
            throw std::runtime_error("cannot clone layer");
        }
        p->shared = shared.clone();
        p->weights = std::make_shared<Array>(*weights);
        p->bias = std::make_shared<Array>(*bias);
        if (policy) {
            p->policy = policy->clone();
        }
        return p;
    }